

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2region_term_indexer.cc
# Opt level: O0

void __thiscall S2RegionTermIndexer::~S2RegionTermIndexer(S2RegionTermIndexer *this)

{
  S2RegionTermIndexer *this_local;
  
  S2RegionCoverer::~S2RegionCoverer(&this->coverer_);
  Options::~Options(&this->options_);
  return;
}

Assistant:

S2RegionTermIndexer::~S2RegionTermIndexer() = default;